

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::insert_key_range_internal
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,key_type start_key,size_t count,bool bypass_verifier)

{
  undefined8 uVar1;
  key_encoder *pkVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  uint64_t key;
  ulong v;
  key_type k;
  value_view v_00;
  undefined1 local_158 [8];
  key_encoder enc;
  
  uVar1 = *(undefined8 *)start_key._M_ptr;
  v = (ulong)uVar1 >> 0x38 | (ulong)(uVar1 & 0xff000000000000) >> 0x28 |
      (ulong)(uVar1 & 0xff0000000000) >> 0x18 | (ulong)(uVar1 & 0xff00000000) >> 8 |
      (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
      uVar1 << 0x38;
  enc.ibuf._248_8_ = local_158;
  enc.buf = (byte *)0x100;
  enc.cap = 0;
  enc.off = count + v;
  puVar5 = test_values + v * 0x10;
  lVar3 = v * 0x10 + 0x1d58b8;
  while( true ) {
    if (enc.off <= v) break;
    enc.cap = 0;
    pkVar2 = key_encoder::encode((key_encoder *)local_158,v);
    lVar4 = (v / 6) * -0x60;
    k._M_extent._M_extent_value = pkVar2->off;
    k._M_ptr = pkVar2->buf;
    v_00._M_extent._M_extent_value = *(size_t *)(lVar3 + lVar4);
    v_00._M_ptr = *(pointer *)(puVar5 + lVar4);
    insert_internal(this,k,v_00,bypass_verifier);
    v = v + 1;
    puVar5 = puVar5 + 0x10;
    lVar3 = lVar3 + 0x10;
  }
  key_encoder::~key_encoder((key_encoder *)local_158);
  return;
}

Assistant:

void insert_key_range_internal(key_type start_key, std::size_t count,
                                 bool bypass_verifier = false) {
    if constexpr (std::is_same_v<key_type, key_view>) {
      // decode to figure out the start key for the loop.
      unodb::key_decoder dec(start_key);
      std::uint64_t start_key_dec;
      dec.decode(start_key_dec);
      unodb::key_encoder enc;
      for (auto key = start_key_dec; key < start_key_dec + count; ++key) {
        insert(enc.reset().encode(key).get_key_view(),
               test_values[key % test_values.size()], bypass_verifier);
      }
    } else {
      for (auto key = start_key; key < start_key + count; ++key) {
        insert(key, test_values[key % test_values.size()], bypass_verifier);
      }
    }
  }